

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

void __thiscall MeCab::Viterbi::Viterbi(Viterbi *this)

{
  this->_vptr_Viterbi = (_func_int **)&PTR__Viterbi_0019ef40;
  (this->tokenizer_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_0019f000;
  (this->tokenizer_).ptr_ = (Tokenizer<mecab_node_t,_mecab_path_t> *)0x0;
  (this->connector_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_0019f030;
  (this->connector_).ptr_ = (Connector *)0x0;
  this->cost_factor_ = 0;
  whatlog::whatlog(&this->what_);
  return;
}

Assistant:

Viterbi::Viterbi()
    :  tokenizer_(0), connector_(0),
       cost_factor_(0) {}